

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

string_view __thiscall
google::protobuf::Reflection::GetStringView
          (Reflection *this,Message *message,FieldDescriptor *field,ScratchSpace *scratch)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int number;
  CppStringType CVar4;
  Reflection *pRVar5;
  Descriptor *actual;
  Descriptor *pDVar6;
  ExtensionSet *this_00;
  string *psVar7;
  DescriptorStringView this_01;
  Cord **ppCVar8;
  ArenaStringPtr *pAVar9;
  DescriptorStringView local_78;
  TaggedStringPtr local_70;
  TaggedStringPtr local_48;
  ArenaStringPtr str;
  Cord *cord;
  ScratchSpace *scratch_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  pRVar5 = Message::GetReflection(message);
  if (this != pRVar5) {
    pDVar6 = this->descriptor_;
    actual = Message::GetDescriptor(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar6,actual,field,"GetStringView");
  }
  pDVar6 = FieldDescriptor::containing_type(field);
  if (pDVar6 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"GetStringView","Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"GetStringView",
               "Field is repeated; the method requires a singular field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_STRING) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetStringView",CPPTYPE_STRING);
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = GetExtensionSet(this,message);
    number = FieldDescriptor::number(field);
    psVar7 = internal::DefaultValueStringAsString_abi_cxx11_(field);
    psVar7 = internal::ExtensionSet::GetString(this_00,number,psVar7);
    _this_local = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
  }
  else {
    bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
    if ((!bVar1) || (bVar1 = HasOneofField(this,message,field), bVar1)) {
      CVar4 = FieldDescriptor::cpp_string_type(field);
      if (CVar4 == kCord) {
        bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
        if (bVar1) {
          ppCVar8 = GetField<absl::lts_20240722::Cord*>(this,message,field);
          local_70.ptr_ = *ppCVar8;
        }
        else {
          local_70.ptr_ = GetField<absl::lts_20240722::Cord>(this,message,field);
        }
        str.tagged_ptr_.ptr_ = (TaggedStringPtr)(TaggedStringPtr)local_70.ptr_;
        _this_local = ScratchSpace::CopyFromCord(scratch,(Cord *)local_70.ptr_);
      }
      else {
        pAVar9 = GetField<google::protobuf::internal::ArenaStringPtr>(this,message,field);
        local_48.ptr_ = (pAVar9->tagged_ptr_).ptr_;
        bVar1 = internal::ArenaStringPtr::IsDefault((ArenaStringPtr *)&local_48);
        if (bVar1) {
          local_78 = FieldDescriptor::default_value_string_abi_cxx11_(field);
        }
        else {
          local_78 = internal::ArenaStringPtr::Get_abi_cxx11_((ArenaStringPtr *)&local_48);
        }
        _this_local = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_78);
      }
    }
    else {
      this_01 = FieldDescriptor::default_value_string_abi_cxx11_(field);
      _this_local = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01);
    }
  }
  return _this_local;
}

Assistant:

absl::string_view Reflection::GetStringView(const Message& message,
                                            const FieldDescriptor* field,
                                            ScratchSpace& scratch) const {
  USAGE_CHECK_ALL(GetStringView, SINGULAR, STRING);

  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(
        field->number(), internal::DefaultValueStringAsString(field));
  }
  if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
    return field->default_value_string();
  }

  switch (field->cpp_string_type()) {
    case FieldDescriptor::CppStringType::kCord: {
      const auto& cord = schema_.InRealOneof(field)
                             ? *GetField<absl::Cord*>(message, field)
                             : GetField<absl::Cord>(message, field);
      return scratch.CopyFromCord(cord);
    }
    default:
      auto str = GetField<ArenaStringPtr>(message, field);
      return str.IsDefault() ? field->default_value_string() : str.Get();
  }
}